

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O0

void PrintFinalStats(void *cvode_mem,int miter,sunrealtype ero)

{
  undefined4 uVar1;
  int in_ESI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  int retval;
  long nfeLS;
  long nje;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst;
  long leniwLS;
  long lenrwLS;
  long leniw;
  long lenrw;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  int local_c;
  undefined8 local_8;
  
  local_18 = in_XMM0_Qa;
  local_c = in_ESI;
  local_8 = in_RDI;
  uVar1 = CVodeGetWorkSpace(in_RDI,&local_20,&local_28);
  check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
  uVar1 = CVodeGetNumSteps(local_8,&local_40);
  check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
  uVar1 = CVodeGetNumRhsEvals(local_8,&local_48);
  check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
  uVar1 = CVodeGetNumLinSolvSetups(local_8,&local_50);
  check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
  uVar1 = CVodeGetNumErrTestFails(local_8,&local_68);
  check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
  uVar1 = CVodeGetNumNonlinSolvIters(local_8,&local_58);
  check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
  uVar1 = CVodeGetNumNonlinSolvConvFails(local_8,&local_60);
  check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
  printf("\n Final statistics for this run:\n\n");
  printf(" CVode real workspace length              = %4ld \n",local_20);
  printf(" CVode integer workspace length           = %4ld \n",local_28);
  printf(" Number of steps                          = %4ld \n",local_40);
  printf(" Number of f-s                            = %4ld \n",local_48);
  printf(" Number of setups                         = %4ld \n",local_50);
  printf(" Number of nonlinear iterations           = %4ld \n",local_58);
  printf(" Number of nonlinear convergence failures = %4ld \n",local_60);
  printf(" Number of error test failures            = %4ld \n\n",local_68);
  if (local_c != 0) {
    if (local_c == 3) {
      local_70 = local_50;
      uVar1 = CVDiagGetNumRhsEvals(local_8,&stack0xffffffffffffff88);
      check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c);
      uVar1 = CVDiagGetWorkSpace(local_8,&local_30,&local_38);
      check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c);
    }
    else {
      uVar1 = CVodeGetNumJacEvals(local_8,&local_70);
      check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c);
      uVar1 = CVodeGetNumLinRhsEvals(local_8,&stack0xffffffffffffff88);
      check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c);
      uVar1 = CVodeGetLinWorkSpace(local_8,&local_30,&local_38);
      check_retval(in_stack_ffffffffffffff88,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c);
    }
    printf(" Linear solver real workspace length      = %4ld \n",local_30);
    printf(" Linear solver integer workspace length   = %4ld \n",local_38);
    printf(" Number of Jacobian evaluations           = %4ld \n",local_70);
    printf(" Number of f evals. in linear solver      = %4ld \n\n",in_stack_ffffffffffffff88);
  }
  printf(" Error overrun = %.3f \n",local_18);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem, int miter, sunrealtype ero)
{
  long int lenrw, leniw, lenrwLS, leniwLS;
  long int nst, nfe, nsetups, nni, ncfn, netf, nje, nfeLS;
  int retval;

  retval = CVodeGetWorkSpace(cvode_mem, &lenrw, &leniw);
  check_retval(&retval, "CVodeGetWorkSpace", 1);
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);

  printf("\n Final statistics for this run:\n\n");
  printf(" CVode real workspace length              = %4ld \n", lenrw);
  printf(" CVode integer workspace length           = %4ld \n", leniw);
  printf(" Number of steps                          = %4ld \n", nst);
  printf(" Number of f-s                            = %4ld \n", nfe);
  printf(" Number of setups                         = %4ld \n", nsetups);
  printf(" Number of nonlinear iterations           = %4ld \n", nni);
  printf(" Number of nonlinear convergence failures = %4ld \n", ncfn);
  printf(" Number of error test failures            = %4ld \n\n", netf);

  if (miter != FUNC)
  {
    if (miter != DIAG)
    {
      retval = CVodeGetNumJacEvals(cvode_mem, &nje);
      check_retval(&retval, "CVodeGetNumJacEvals", 1);
      retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
      check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);
      retval = CVodeGetLinWorkSpace(cvode_mem, &lenrwLS, &leniwLS);
      check_retval(&retval, "CVodeGetLinWorkSpace", 1);
    }
    else
    {
      nje    = nsetups;
      retval = CVDiagGetNumRhsEvals(cvode_mem, &nfeLS);
      check_retval(&retval, "CVDiagGetNumRhsEvals", 1);
      retval = CVDiagGetWorkSpace(cvode_mem, &lenrwLS, &leniwLS);
      check_retval(&retval, "CVDiagGetWorkSpace", 1);
    }
    printf(" Linear solver real workspace length      = %4ld \n", lenrwLS);
    printf(" Linear solver integer workspace length   = %4ld \n", leniwLS);
    printf(" Number of Jacobian evaluations           = %4ld \n", nje);
    printf(" Number of f evals. in linear solver      = %4ld \n\n", nfeLS);
  }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf(" Error overrun = %.3Lf \n", ero);
#else
  printf(" Error overrun = %.3f \n", ero);
#endif
}